

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O2

ThresholdState __thiscall
AbstractThresholdConditionChecker::GetStateFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindexPrev,Params *params,
          ThresholdConditionCache *cache)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar8;
  int64_t iVar9;
  mapped_type *pmVar10;
  int iVar11;
  ThresholdState TVar12;
  CBlockIndex *this_00;
  long in_FS_OFFSET;
  bool bVar13;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToCompute;
  CBlockIndex *pindexPrev_local;
  long local_38;
  long lVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pindexPrev_local = pindexPrev;
  iVar1 = (*this->_vptr_AbstractThresholdConditionChecker[4])(this,params);
  iVar2 = (*this->_vptr_AbstractThresholdConditionChecker[5])(this,params);
  iVar3 = (*this->_vptr_AbstractThresholdConditionChecker[3])(this,params);
  iVar4 = (*this->_vptr_AbstractThresholdConditionChecker[1])(this,params);
  lVar7 = CONCAT44(extraout_var,iVar4);
  iVar4 = (*this->_vptr_AbstractThresholdConditionChecker[2])(this,params);
  if (lVar7 == -1) {
    TVar12 = ACTIVE;
  }
  else if (lVar7 == -2) {
    TVar12 = FAILED;
  }
  else {
    if (pindexPrev != (CBlockIndex *)0x0) {
      pindexPrev_local =
           CBlockIndex::GetAncestor
                     (pindexPrev,pindexPrev->nHeight - (pindexPrev->nHeight + 1) % iVar1);
    }
    vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (sVar8 = std::
                   map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                   ::count(cache,&pindexPrev_local), sVar8 == 0) {
      if ((pindexPrev_local == (CBlockIndex *)0x0) ||
         (iVar9 = CBlockIndex::GetMedianTimePast(pindexPrev_local), iVar9 < lVar7)) {
        pmVar10 = std::
                  map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                  ::operator[](cache,&pindexPrev_local);
        *pmVar10 = DEFINED;
        break;
      }
      std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                (&vToCompute,&pindexPrev_local);
      pindexPrev_local =
           CBlockIndex::GetAncestor(pindexPrev_local,pindexPrev_local->nHeight - iVar1);
    }
    sVar8 = std::
            map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
            ::count(cache,&pindexPrev_local);
    if (sVar8 == 0) {
      __assert_fail("cache.count(pindexPrev)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/versionbits.cpp"
                    ,0x32,
                    "ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex *, const Consensus::Params &, ThresholdConditionCache &) const"
                   );
    }
    pmVar10 = std::
              map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
              ::operator[](cache,&pindexPrev_local);
    TVar12 = *pmVar10;
    iVar5 = 0;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    while (vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = vToCompute.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1];
      vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           vToCompute.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      pindexPrev_local = this_00;
      if (TVar12 == DEFINED) {
        iVar9 = CBlockIndex::GetMedianTimePast(this_00);
        TVar12 = (ThresholdState)(lVar7 <= iVar9);
      }
      else if (TVar12 == LOCKED_IN) {
        TVar12 = this_00->nHeight + 1 < iVar3 ^ ACTIVE;
      }
      else if (TVar12 == STARTED) {
        iVar11 = 0;
        iVar1 = iVar5;
        while (bVar13 = iVar1 != 0, iVar1 = iVar1 + -1, bVar13) {
          uVar6 = (**this->_vptr_AbstractThresholdConditionChecker)(this,this_00,params);
          iVar11 = iVar11 + (uVar6 & 0xff);
          this_00 = this_00->pprev;
        }
        TVar12 = LOCKED_IN;
        if (iVar11 < iVar2) {
          iVar9 = CBlockIndex::GetMedianTimePast(pindexPrev_local);
          TVar12 = (uint)(CONCAT44(extraout_var_00,iVar4) <= iVar9) * 3 + STARTED;
        }
      }
      pmVar10 = std::
                map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                ::operator[](cache,&pindexPrev_local);
      *pmVar10 = TVar12;
    }
    std::_Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~_Vector_base
              (&vToCompute.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return TVar12;
}

Assistant:

ThresholdState AbstractThresholdConditionChecker::GetStateFor(const CBlockIndex* pindexPrev, const Consensus::Params& params, ThresholdConditionCache& cache) const
{
    int nPeriod = Period(params);
    int nThreshold = Threshold(params);
    int min_activation_height = MinActivationHeight(params);
    int64_t nTimeStart = BeginTime(params);
    int64_t nTimeTimeout = EndTime(params);

    // Check if this deployment is always active.
    if (nTimeStart == Consensus::BIP9Deployment::ALWAYS_ACTIVE) {
        return ThresholdState::ACTIVE;
    }

    // Check if this deployment is never active.
    if (nTimeStart == Consensus::BIP9Deployment::NEVER_ACTIVE) {
        return ThresholdState::FAILED;
    }

    // A block's state is always the same as that of the first of its period, so it is computed based on a pindexPrev whose height equals a multiple of nPeriod - 1.
    if (pindexPrev != nullptr) {
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod));
    }

    // Walk backwards in steps of nPeriod to find a pindexPrev whose information is known
    std::vector<const CBlockIndex*> vToCompute;
    while (cache.count(pindexPrev) == 0) {
        if (pindexPrev == nullptr) {
            // The genesis block is by definition defined.
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        if (pindexPrev->GetMedianTimePast() < nTimeStart) {
            // Optimization: don't recompute down further, as we know every earlier block will be before the start time
            cache[pindexPrev] = ThresholdState::DEFINED;
            break;
        }
        vToCompute.push_back(pindexPrev);
        pindexPrev = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);
    }

    // At this point, cache[pindexPrev] is known
    assert(cache.count(pindexPrev));
    ThresholdState state = cache[pindexPrev];

    // Now walk forward and compute the state of descendants of pindexPrev
    while (!vToCompute.empty()) {
        ThresholdState stateNext = state;
        pindexPrev = vToCompute.back();
        vToCompute.pop_back();

        switch (state) {
            case ThresholdState::DEFINED: {
                if (pindexPrev->GetMedianTimePast() >= nTimeStart) {
                    stateNext = ThresholdState::STARTED;
                }
                break;
            }
            case ThresholdState::STARTED: {
                // We need to count
                const CBlockIndex* pindexCount = pindexPrev;
                int count = 0;
                for (int i = 0; i < nPeriod; i++) {
                    if (Condition(pindexCount, params)) {
                        count++;
                    }
                    pindexCount = pindexCount->pprev;
                }
                if (count >= nThreshold) {
                    stateNext = ThresholdState::LOCKED_IN;
                } else if (pindexPrev->GetMedianTimePast() >= nTimeTimeout) {
                    stateNext = ThresholdState::FAILED;
                }
                break;
            }
            case ThresholdState::LOCKED_IN: {
                // Progresses into ACTIVE provided activation height will have been reached.
                if (pindexPrev->nHeight + 1 >= min_activation_height) {
                    stateNext = ThresholdState::ACTIVE;
                }
                break;
            }
            case ThresholdState::FAILED:
            case ThresholdState::ACTIVE: {
                // Nothing happens, these are terminal states.
                break;
            }
        }
        cache[pindexPrev] = state = stateNext;
    }

    return state;
}